

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpConnection.cpp
# Opt level: O0

void __thiscall sznet::net::KcpConnection::~KcpConnection(KcpConnection *this)

{
  bool bVar1;
  LogLevel LVar2;
  LogStream *pLVar3;
  self *psVar4;
  pointer pCVar5;
  char *in_RSI;
  SourceFile file;
  undefined1 local_ff0 [12];
  Logger local_fe0;
  KcpConnection *local_10;
  KcpConnection *this_local;
  
  local_10 = this;
  LVar2 = Logger::logLevel();
  if ((int)LVar2 < 2) {
    Logger::SourceFile::SourceFile<104>
              ((SourceFile *)local_ff0,
               (char (*) [104])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpConnection.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_ff0._0_8_;
    file.m_size = local_ff0._8_4_;
    Logger::Logger(&local_fe0,file,0x3a,DEBUG,"~KcpConnection");
    pLVar3 = Logger::stream(&local_fe0);
    psVar4 = LogStream::operator<<(pLVar3,"KcpConnection::dtor[");
    psVar4 = LogStream::operator<<(psVar4,&this->m_name);
    psVar4 = LogStream::operator<<(psVar4,"] at ");
    pLVar3 = LogStream::operator<<(psVar4,this);
    psVar4 = LogStream::operator<<(pLVar3," id=");
    pLVar3 = LogStream::operator<<(psVar4,this->m_id);
    psVar4 = LogStream::operator<<(pLVar3," state=");
    in_RSI = stateToString(this);
    LogStream::operator<<(psVar4,in_RSI);
    Logger::~Logger(&local_fe0);
  }
  if (this->m_state != kDisconnected) {
    __assert_fail("m_state == kDisconnected",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpConnection.cpp"
                  ,0x3d,"sznet::net::KcpConnection::~KcpConnection()");
  }
  if (this->m_kcp != (ikcpcb *)0x0) {
    ikcp_release(this->m_kcp);
    this->m_kcp = (ikcpcb *)0x0;
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_udpChannel);
  if ((bVar1) && ((this->m_isClient & 1U) != 0)) {
    pCVar5 = std::unique_ptr<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>::
             operator->(&this->m_udpChannel);
    Channel::disableAll(pCVar5);
    pCVar5 = std::unique_ptr<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>::
             operator->(&this->m_udpChannel);
    Channel::remove(pCVar5,in_RSI);
  }
  std::unique_ptr<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>::~unique_ptr
            (&this->m_udpChannel);
  Buffer::~Buffer(&this->m_outputBuffer);
  Buffer::~Buffer(&this->m_inputBuffer);
  std::function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&,_int)>::~function
            (&this->m_kcpCloseCallback);
  std::function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&,_unsigned_long)>::~function
            (&this->m_kcpHighWaterMarkCallback);
  std::function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&)>::~function
            (&this->m_kcpWriteCompleteCallback);
  std::
  function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&,_sznet::net::Buffer_*,_sznet::Timestamp)>
  ::~function(&this->m_kcpMessageCallback);
  std::function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&)>::~function
            (&this->m_kcpConnectionCallback);
  std::unique_ptr<sznet::net::InetAddress,_std::default_delete<sznet::net::InetAddress>_>::
  ~unique_ptr(&this->m_peerAddr);
  std::__cxx11::string::~string((string *)&this->m_name);
  Socket::~Socket(&this->m_udpSocket);
  std::enable_shared_from_this<sznet::net::KcpConnection>::~enable_shared_from_this
            (&this->super_enable_shared_from_this<sznet::net::KcpConnection>);
  return;
}

Assistant:

KcpConnection::~KcpConnection()
{
	LOG_DEBUG << "KcpConnection::dtor[" << m_name << "] at " << this
		<< " id=" << m_id
		<< " state=" << stateToString();
	assert(m_state == kDisconnected);
	if (m_kcp)
	{
		ikcp_release(m_kcp);
		m_kcp = nullptr;
	}
	if (m_udpChannel && m_isClient)
	{
		m_udpChannel->disableAll();
		m_udpChannel->remove();
	}
}